

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O2

void test_read_format_rar5_block_size_is_too_small(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  la_ssize_t lVar3;
  archive_entry *ae;
  char buf [4096];
  archive_entry *local_1020;
  undefined1 local_1018 [4096];
  
  extract_reference_file("test_read_format_rar5_block_size_is_too_small.rar");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ԡ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ԡ',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ԡ',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_rar5_block_size_is_too_small.rar",0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ԡ',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, \"test_read_format_rar5_block_size_is_too_small.rar\", 10240)"
                   ,a);
  iVar1 = archive_read_next_header((archive *)a,&local_1020);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ԧ',(uint)(iVar1 != 0),"archive_read_next_header(a, &ae) != ARCHIVE_OK",a);
  lVar3 = archive_read_data((archive *)a,local_1018,0x1000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'Ԩ',(uint)(lVar3 < 1),"archive_read_data(a, buf, sizeof(buf)) <= 0",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'Ԫ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'Ԫ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar5_block_size_is_too_small)
{
	char buf[4096];
	PROLOGUE("test_read_format_rar5_block_size_is_too_small.rar");

	/* This file is damaged, so those functions should return failure.
	 * Additionally, SIGSEGV shouldn't be raised during execution
	 * of those functions. */

	assertA(archive_read_next_header(a, &ae) != ARCHIVE_OK);
	assertA(archive_read_data(a, buf, sizeof(buf)) <= 0);

	EPILOGUE();
}